

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

void ray_intersect_triangles_all
               (vec3 ro,vec3 rd,vec3 *points,int num_points,mat4 transform,float *t)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Bool _Var6;
  long lVar7;
  vec3 *pvVar8;
  float fVar9;
  float in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  float in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  vec3 vVar10;
  vec3 vVar11;
  vec3 p;
  vec3 q;
  vec3 a;
  vec3 b;
  float local_94;
  undefined8 local_90;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  local_84 = ro.z;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = ro._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  local_58 = rd.x + ro.x;
  fStack_54 = rd.y + ro.y;
  fStack_50 = in_XMM2_Dc + in_XMM0_Dc;
  fStack_4c = in_XMM2_Dd + in_XMM0_Dd;
  local_80 = rd.z + local_84;
  pvVar8 = points + 2;
  for (lVar7 = 0; lVar7 < num_points; lVar7 = lVar7 + 3) {
    uVar1 = pvVar8[-1].x;
    uVar2 = pvVar8[-1].y;
    local_78._4_4_ = uVar2;
    local_78._0_4_ = uVar1;
    local_78._8_8_ = 0;
    fVar9 = pvVar8[-1].z;
    local_88 = pvVar8->z;
    local_90._0_4_ = pvVar8->x;
    local_90._4_4_ = pvVar8->y;
    vVar10 = vec3_apply_mat4(pvVar8[-2],1.0,transform);
    auVar3 = local_78;
    local_7c = vVar10.z;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = vVar10._0_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    vVar11.z = fVar9;
    vVar11.x = (float)local_78._0_4_;
    vVar11.y = (float)local_78._4_4_;
    local_78 = auVar3;
    vVar11 = vec3_apply_mat4(vVar11,1.0,transform);
    local_78._8_4_ = extraout_XMM0_Dc_00;
    local_78._0_8_ = vVar11._0_8_;
    local_78._12_4_ = extraout_XMM0_Dd_00;
    vVar10.z = local_88;
    vVar10.x = (float)(undefined4)local_90;
    vVar10.y = (float)local_90._4_4_;
    vVar10 = vec3_apply_mat4(vVar10,1.0,transform);
    auVar5 = local_48;
    auVar4 = local_68;
    auVar3 = local_78;
    local_88 = vVar10.z;
    local_90 = vVar10._0_8_;
    local_94 = 3.4028235e+38;
    q.y = fStack_54;
    q.x = local_58;
    p.z = local_84;
    p.x = (float)local_68._0_4_;
    p.y = (float)local_68._4_4_;
    q.z = local_80;
    a.z = local_7c;
    a.x = (float)local_48._0_4_;
    a.y = (float)local_48._4_4_;
    b.z = vVar11.z;
    b.x = (float)local_78._0_4_;
    b.y = (float)local_78._4_4_;
    local_78 = auVar3;
    local_68 = auVar4;
    local_48 = auVar5;
    _Var6 = intersect_segment_triangle(p,q,a,b,vVar10,&local_94);
    fVar9 = local_94;
    if (!_Var6) {
      fVar9 = 3.4028235e+38;
    }
    *t = fVar9;
    t = t + 1;
    pvVar8 = pvVar8 + 3;
  }
  return;
}

Assistant:

void ray_intersect_triangles_all(vec3 ro, vec3 rd, vec3 *points, int num_points, mat4 transform, float *t) { 
    for (int i = 0; i < num_points; i += 3) {
        vec3 tp0 = points[i + 0];
        vec3 tp1 = points[i + 1];
        vec3 tp2 = points[i + 2];
        tp0 = vec3_apply_mat4(tp0, 1.0f, transform);
        tp1 = vec3_apply_mat4(tp1, 1.0f, transform);
        tp2 = vec3_apply_mat4(tp2, 1.0f, transform);

        float t0 = FLT_MAX;
        if (intersect_segment_triangle(ro, vec3_add(ro, rd), tp0, tp1, tp2, &t0)) {
            t[i/3] = t0;    
        }
        else {
            t[i/3] = FLT_MAX;
        }
    }
}